

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  undefined8 *puVar1;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  type_conflict5 tVar6;
  double *pdVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  long lVar8;
  int j;
  long lVar9;
  Item *pIVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_a0;
  soplex local_68 [56];
  
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar10 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  pdVar7 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,*pdVar7,(type *)0x0);
  iVar2 = pDVar3->data[i];
  lVar8 = 0x38;
  for (lVar9 = 0;
      lVar9 < (pIVar10->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused; lVar9 = lVar9 + 1) {
    pNVar5 = (pIVar10->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    puVar1 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar8);
    local_d8 = *puVar1;
    uStack_d0 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar8 + -0x28);
    local_c8 = *puVar1;
    uStack_c0 = puVar1[1];
    local_b8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar8 + -0x18);
    local_b0 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar8 + -0x10);
    local_ac = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar8 + -0xc);
    local_a8 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar8 + -8);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_68,(soplex *)&local_d8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(pDVar4->data[*(int *)((long)&(pNVar5->val).m_backend.data + lVar8)]
                                + iVar2),CONCAT31((int3)((uint)local_b0 >> 8),local_ac));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
              (&local_a0,local_68,a);
    local_118.m_backend.data._M_elems[8] = local_a0.m_backend.data._M_elems[8];
    local_118.m_backend.data._M_elems[9] = local_a0.m_backend.data._M_elems[9];
    local_118.m_backend.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
    local_118.m_backend.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
    local_118.m_backend.data._M_elems[6] = local_a0.m_backend.data._M_elems[6];
    local_118.m_backend.data._M_elems[7] = local_a0.m_backend.data._M_elems[7];
    local_118.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
    local_118.m_backend.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
    local_118.m_backend.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
    local_118.m_backend.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
    local_118.m_backend.exp = local_a0.m_backend.exp;
    local_118.m_backend.neg = local_a0.m_backend.neg;
    local_118.m_backend.fpclass = local_a0.m_backend.fpclass;
    local_118.m_backend.prec_elem = local_a0.m_backend.prec_elem;
    tVar6 = boost::multiprecision::operator<(&local_118,__return_storage_ptr__);
    if (tVar6) {
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           local_118.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_118.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           local_118.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_118.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_118.m_backend.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_118.m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = local_118.m_backend.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_118.m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_118.m_backend.prec_elem;
    }
    lVar8 = lVar8 + 0x3c;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getColMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nCols());
   assert(i >= 0);

   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& colVec = lp.LPColSetBase<R>::colVector(i);

   R min = R(infinity);
   int exp1;
   int exp2 = colscaleExp[i];

   for(int j = 0; j < colVec.size(); j++)
   {
      exp1 = rowscaleExp[colVec.index(j)];
      R abs = spxAbs(spxLdexp(colVec.value(j), -exp1 - exp2));

      if(abs < min)
         min = abs;
   }

   return min;
}